

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O0

int CreateScratchFunc(VMFunctionBuilder *buildit,int value1,int value2)

{
  int value;
  FSoundID *this;
  int value2_local;
  int value1_local;
  VMFunctionBuilder *buildit_local;
  
  VMFunctionBuilder::EmitParamInt(buildit,value1);
  if (value2 == 0) {
    buildit_local._4_4_ = 1;
  }
  else {
    this = TArray<FSoundID,_FSoundID>::operator[](&SoundMap,(long)(value2 + -1));
    value = FSoundID::operator_cast_to_int(this);
    VMFunctionBuilder::EmitParamInt(buildit,value);
    buildit_local._4_4_ = 2;
  }
  return buildit_local._4_4_;
}

Assistant:

static int CreateScratchFunc(VMFunctionBuilder &buildit, int value1, int value2)
{ // A_CustomMeleeAttack
	buildit.EmitParamInt(value1);					// damage
	if (value2)
	{
		buildit.EmitParamInt(SoundMap[value2-1]);	// hit sound
		return 2;
	}
	return 1;
}